

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O2

void __thiscall
LogManager::Logger<std::shared_ptr<spdlog::logger>_>::Logger
          (Logger<std::shared_ptr<spdlog::logger>_> *this,
          ILogger<std::shared_ptr<spdlog::logger>_> **logger)

{
  (this->super_ILogger<std::shared_ptr<spdlog::logger>_>).LOG_MESSAGE_BUFFER_SIZE = 0x400;
  (this->super_ILogger<std::shared_ptr<spdlog::logger>_>).m_log.
  super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ILogger<std::shared_ptr<spdlog::logger>_>).m_log.
  super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ILogger<std::shared_ptr<spdlog::logger>_>)._vptr_ILogger =
       (_func_int **)&PTR__Logger_0013aff0;
  std::
  __shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>>,void>
            ((__shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>>,(__gnu_cxx::_Lock_policy)2>
              *)&this->m_logger,*logger);
  return;
}

Assistant:

Logger(Interfaces::ILogger<T>*&& logger) : m_logger(logger) {}